

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_dispatcher_template.hpp
# Opt level: O1

__pid_t __thiscall
so_5::disp::reuse::
proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
::wait(proxy_dispatcher_template_t<so_5::disp::one_thread::impl::actual_disp_iface_t,_so_5::disp::one_thread::disp_params_t>
       *this,void *__stat_loc)

{
  actual_disp_iface_t *paVar1;
  int iVar2;
  
  iVar2 = (*(((this->m_disp)._M_t.
              super___uniq_ptr_impl<so_5::disp::one_thread::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>_>
              ._M_t.
              super__Tuple_impl<0UL,_so_5::disp::one_thread::impl::actual_disp_iface_t_*,_std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>_>
              .super__Head_base<0UL,_so_5::disp::one_thread::impl::actual_disp_iface_t_*,_false>.
             _M_head_impl)->super_dispatcher_t)._vptr_dispatcher_t[4])();
  paVar1 = (this->m_disp)._M_t.
           super___uniq_ptr_impl<so_5::disp::one_thread::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::disp::one_thread::impl::actual_disp_iface_t_*,_std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>_>
           .super__Head_base<0UL,_so_5::disp::one_thread::impl::actual_disp_iface_t_*,_false>.
           _M_head_impl;
  (this->m_disp)._M_t.
  super___uniq_ptr_impl<so_5::disp::one_thread::impl::actual_disp_iface_t,_std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::disp::one_thread::impl::actual_disp_iface_t_*,_std::default_delete<so_5::disp::one_thread::impl::actual_disp_iface_t>_>
  .super__Head_base<0UL,_so_5::disp::one_thread::impl::actual_disp_iface_t_*,_false>._M_head_impl =
       (actual_disp_iface_t *)0x0;
  if (paVar1 != (actual_disp_iface_t *)0x0) {
    iVar2 = (*(paVar1->super_dispatcher_t)._vptr_dispatcher_t[1])();
    return iVar2;
  }
  return iVar2;
}

Assistant:

virtual void
		wait() override
			{
				m_disp->wait();

				m_disp.reset();
			}